

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void Curl_conn_free(Curl_easy *data,connectdata *conn)

{
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr__Bool *p_Var1;
  long lVar2;
  
  if (((conn->handler != (Curl_handler *)0x0) &&
      (p_Var1 = conn->handler->disconnect,
      p_Var1 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr__Bool *)0x0)) &&
     (((conn->bits).field_0x3 & 0x40) == 0)) {
    (*p_Var1)(data,conn,true);
  }
  lVar2 = 0;
  do {
    Curl_conn_cf_discard_all(data,conn,(int)lVar2);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  (*Curl_cfree)((conn->http_proxy).user);
  (conn->http_proxy).user = (char *)0x0;
  (*Curl_cfree)((conn->socks_proxy).user);
  (conn->socks_proxy).user = (char *)0x0;
  (*Curl_cfree)((conn->http_proxy).passwd);
  (conn->http_proxy).passwd = (char *)0x0;
  (*Curl_cfree)((conn->socks_proxy).passwd);
  (conn->socks_proxy).passwd = (char *)0x0;
  (*Curl_cfree)((conn->http_proxy).host.rawalloc);
  (conn->http_proxy).host.rawalloc = (char *)0x0;
  (*Curl_cfree)((conn->socks_proxy).host.rawalloc);
  (conn->socks_proxy).host.rawalloc = (char *)0x0;
  (*Curl_cfree)(conn->user);
  conn->user = (char *)0x0;
  (*Curl_cfree)(conn->passwd);
  conn->passwd = (char *)0x0;
  (*Curl_cfree)(conn->sasl_authzid);
  conn->sasl_authzid = (char *)0x0;
  (*Curl_cfree)(conn->options);
  conn->options = (char *)0x0;
  (*Curl_cfree)(conn->oauth_bearer);
  conn->oauth_bearer = (char *)0x0;
  (*Curl_cfree)((conn->host).rawalloc);
  (conn->host).rawalloc = (char *)0x0;
  (*Curl_cfree)((conn->conn_to_host).rawalloc);
  (conn->conn_to_host).rawalloc = (char *)0x0;
  (*Curl_cfree)(conn->hostname_resolve);
  conn->hostname_resolve = (char *)0x0;
  (*Curl_cfree)(conn->secondaryhostname);
  conn->secondaryhostname = (char *)0x0;
  (*Curl_cfree)(conn->localdev);
  conn->localdev = (char *)0x0;
  Curl_ssl_conn_config_cleanup(conn);
  (*Curl_cfree)(conn->unix_domain_socket);
  conn->unix_domain_socket = (char *)0x0;
  (*Curl_cfree)(conn->destination);
  conn->destination = (char *)0x0;
  (*Curl_cfree)(conn);
  return;
}

Assistant:

void Curl_conn_free(struct Curl_easy *data, struct connectdata *conn)
{
  size_t i;

  DEBUGASSERT(conn);

  if(conn->handler && conn->handler->disconnect &&
     !conn->bits.shutdown_handler)
    conn->handler->disconnect(data, conn, TRUE);

  for(i = 0; i < CURL_ARRAYSIZE(conn->cfilter); ++i) {
    Curl_conn_cf_discard_all(data, conn, (int)i);
  }

  Curl_free_idnconverted_hostname(&conn->host);
  Curl_free_idnconverted_hostname(&conn->conn_to_host);
#ifndef CURL_DISABLE_PROXY
  Curl_free_idnconverted_hostname(&conn->http_proxy.host);
  Curl_free_idnconverted_hostname(&conn->socks_proxy.host);
  Curl_safefree(conn->http_proxy.user);
  Curl_safefree(conn->socks_proxy.user);
  Curl_safefree(conn->http_proxy.passwd);
  Curl_safefree(conn->socks_proxy.passwd);
  Curl_safefree(conn->http_proxy.host.rawalloc); /* http proxy name buffer */
  Curl_safefree(conn->socks_proxy.host.rawalloc); /* socks proxy name buffer */
#endif
  Curl_sec_conn_destroy(conn);
  Curl_safefree(conn->user);
  Curl_safefree(conn->passwd);
  Curl_safefree(conn->sasl_authzid);
  Curl_safefree(conn->options);
  Curl_safefree(conn->oauth_bearer);
  Curl_safefree(conn->host.rawalloc); /* hostname buffer */
  Curl_safefree(conn->conn_to_host.rawalloc); /* hostname buffer */
  Curl_safefree(conn->hostname_resolve);
  Curl_safefree(conn->secondaryhostname);
  Curl_safefree(conn->localdev);
  Curl_ssl_conn_config_cleanup(conn);

#ifdef USE_UNIX_SOCKETS
  Curl_safefree(conn->unix_domain_socket);
#endif
  Curl_safefree(conn->destination);

  free(conn); /* free all the connection oriented data */
}